

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanStreamStart(Scanner *this)

{
  char cVar1;
  size_t sStack_60;
  Token local_50;
  
  this->IsStartOfStream = false;
  local_50._0_8_ = this->Current;
  local_50.Range.Data = this->End + -local_50._0_8_;
  if (local_50.Range.Data != (iterator)0x0) {
    cVar1 = StringRef::operator[]((StringRef *)&local_50,0);
    if (cVar1 == -1) {
      if ((((local_50.Range.Data < (iterator)0x4) ||
           (cVar1 = StringRef::operator[]((StringRef *)&local_50,1), cVar1 != -2)) ||
          (cVar1 = StringRef::operator[]((StringRef *)&local_50,2), cVar1 != '\0')) ||
         (cVar1 = StringRef::operator[]((StringRef *)&local_50,3), cVar1 != '\0')) {
        if ((local_50.Range.Data < (iterator)0x2) ||
           (cVar1 = StringRef::operator[]((StringRef *)&local_50,1), cVar1 != -2))
        goto LAB_001736ad;
LAB_00173656:
        sStack_60 = 2;
      }
      else {
LAB_001736ff:
        sStack_60 = 4;
      }
LAB_00173658:
      goto LAB_001736b0;
    }
    if (cVar1 == -0x11) {
      if ((((iterator)0x2 < local_50.Range.Data) &&
          (cVar1 = StringRef::operator[]((StringRef *)&local_50,1), cVar1 == -0x45)) &&
         (cVar1 = StringRef::operator[]((StringRef *)&local_50,2), cVar1 == -0x41)) {
        sStack_60 = 3;
        goto LAB_00173658;
      }
    }
    else if (cVar1 == -2) {
      if (((iterator)0x1 < local_50.Range.Data) &&
         (cVar1 = StringRef::operator[]((StringRef *)&local_50,1), cVar1 == -1)) goto LAB_00173656;
    }
    else {
      if (cVar1 == '\0') {
        if ((iterator)0x3 < local_50.Range.Data) {
          cVar1 = StringRef::operator[]((StringRef *)&local_50,1);
          if (((cVar1 == '\0') &&
              (cVar1 = StringRef::operator[]((StringRef *)&local_50,2), cVar1 == -2)) &&
             (cVar1 = StringRef::operator[]((StringRef *)&local_50,3), cVar1 == -1))
          goto LAB_001736ff;
          cVar1 = StringRef::operator[]((StringRef *)&local_50,1);
          if (((cVar1 == '\0') &&
              (cVar1 = StringRef::operator[]((StringRef *)&local_50,2), cVar1 == '\0')) &&
             (cVar1 = StringRef::operator[]((StringRef *)&local_50,3), cVar1 != '\0'))
          goto LAB_001736ad;
        }
      }
      else if (((((iterator)0x3 < local_50.Range.Data) &&
                (cVar1 = StringRef::operator[]((StringRef *)&local_50,1), cVar1 == '\0')) &&
               (cVar1 = StringRef::operator[]((StringRef *)&local_50,2), cVar1 == '\0')) &&
              (cVar1 = StringRef::operator[]((StringRef *)&local_50,3), cVar1 == '\0'))
      goto LAB_001736ad;
      if ((iterator)0x1 < local_50.Range.Data) {
        StringRef::operator[]((StringRef *)&local_50,1);
      }
    }
  }
LAB_001736ad:
  sStack_60 = 0;
LAB_001736b0:
  local_50.Value._M_dataplus._M_p = (pointer)&local_50.Value.field_2;
  local_50.Value._M_string_length = 0;
  local_50.Value.field_2._M_local_buf[0] = '\0';
  local_50.Kind = 1;
  local_50.Range.Data = this->Current;
  local_50.Range.Length = sStack_60;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_50);
  this->Current = this->Current + sStack_60;
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanStreamStart() {
  IsStartOfStream = false;

  EncodingInfo EI = getUnicodeEncoding(currentInput());

  Token T;
  T.Kind = Token::TK_StreamStart;
  T.Range = StringRef(Current, EI.second);
  TokenQueue.push_back(T);
  Current += EI.second;
  return true;
}